

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

TokenType __thiscall
google::protobuf::io::Tokenizer::ConsumeNumber
          (Tokenizer *this,bool started_with_zero,bool started_with_dot)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,started_with_zero) == 0) {
LAB_002ce5b5:
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
    bVar3 = 1;
    if (!started_with_dot) {
      bVar2 = TryConsume(this,'.');
      if (bVar2) {
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
      }
      else {
        bVar3 = 0;
      }
    }
    bVar2 = TryConsume(this,'e');
    if ((bVar2) || (bVar2 = TryConsume(this,'E'), bVar2)) {
      bVar2 = TryConsume(this,'-');
      if (!bVar2) {
        TryConsume(this,'+');
      }
      if ((byte)(this->current_char_ - 0x30U) < 10) {
        do {
          NextChar(this);
        } while ((byte)(this->current_char_ - 0x30U) < 10);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_38,"\"e\" must be followed by exponent.",&local_39);
        AddError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
      bVar3 = 1;
    }
    if ((this->allow_f_after_float_ == true) &&
       ((bVar2 = TryConsume(this,'f'), bVar2 || (bVar2 = TryConsume(this,'F'), bVar2)))) {
      bVar3 = 1;
    }
  }
  else {
    bVar2 = TryConsume(this,'x');
    if ((bVar2) || (bVar2 = TryConsume(this,'X'), bVar2)) {
      bVar2 = anon_unknown_4::HexDigit::InClass(this->current_char_);
      if (bVar2) {
        do {
          NextChar(this);
          bVar2 = anon_unknown_4::HexDigit::InClass(this->current_char_);
        } while (bVar2);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_38,"\"0x\" must be followed by hex digits.",&local_39);
        AddError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
    else {
      bVar3 = this->current_char_;
      if (9 < (byte)(bVar3 - 0x30)) goto LAB_002ce5b5;
      while ((bVar3 & 0xf8) == 0x30) {
        NextChar(this);
        bVar3 = this->current_char_;
      }
      if ((byte)(bVar3 - 0x30) < 10) {
        std::__cxx11::string::string
                  ((string *)&local_38,"Numbers starting with leading zero must be in octal.",
                   &local_39);
        AddError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Digit>(this);
      }
    }
    bVar3 = 0;
  }
  bVar1 = this->current_char_;
  if (((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) &&
     (this->require_space_after_number_ == true)) {
    std::__cxx11::string::string
              ((string *)&local_38,"Need space between number and identifier.",&local_39);
    AddError(this,&local_38);
  }
  else {
    if (bVar1 != 0x2e) goto LAB_002ce736;
    if (bVar3 == 0) {
      std::__cxx11::string::string
                ((string *)&local_38,"Hex and octal numbers must be integers.",&local_39);
      AddError(this,&local_38);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "Already saw decimal point or exponent; can\'t have another one.",&local_39);
      AddError(this,&local_38);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
LAB_002ce736:
  return bVar3 + TYPE_INTEGER;
}

Assistant:

Tokenizer::TokenType Tokenizer::ConsumeNumber(bool started_with_zero,
                                              bool started_with_dot) {
  bool is_float = false;

  if (started_with_zero && (TryConsume('x') || TryConsume('X'))) {
    // A hex number (started with "0x").
    ConsumeOneOrMore<HexDigit>("\"0x\" must be followed by hex digits.");

  } else if (started_with_zero && LookingAt<Digit>()) {
    // An octal number (had a leading zero).
    ConsumeZeroOrMore<OctalDigit>();
    if (LookingAt<Digit>()) {
      AddError("Numbers starting with leading zero must be in octal.");
      ConsumeZeroOrMore<Digit>();
    }

  } else {
    // A decimal number.
    if (started_with_dot) {
      is_float = true;
      ConsumeZeroOrMore<Digit>();
    } else {
      ConsumeZeroOrMore<Digit>();

      if (TryConsume('.')) {
        is_float = true;
        ConsumeZeroOrMore<Digit>();
      }
    }

    if (TryConsume('e') || TryConsume('E')) {
      is_float = true;
      TryConsume('-') || TryConsume('+');
      ConsumeOneOrMore<Digit>("\"e\" must be followed by exponent.");
    }

    if (allow_f_after_float_ && (TryConsume('f') || TryConsume('F'))) {
      is_float = true;
    }
  }

  if (LookingAt<Letter>() && require_space_after_number_) {
    AddError("Need space between number and identifier.");
  } else if (current_char_ == '.') {
    if (is_float) {
      AddError(
          "Already saw decimal point or exponent; can't have another one.");
    } else {
      AddError("Hex and octal numbers must be integers.");
    }
  }

  return is_float ? TYPE_FLOAT : TYPE_INTEGER;
}